

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_NtkTimeSetRequired(Abc_Ntk_t *pNtk,int ObjId,float Rise,float Fall)

{
  float *pfVar1;
  Abc_ManTime_t *pAVar2;
  Abc_Time_t *pTime;
  Vec_Ptr_t *vTimes;
  float Fall_local;
  float Rise_local;
  int ObjId_local;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
    pAVar2 = Abc_ManTimeStart(pNtk);
    pNtk->pManTime = pAVar2;
  }
  Abc_ManTimeExpand(pNtk->pManTime,ObjId + 1,1);
  pfVar1 = (float *)pNtk->pManTime->vReqs->pArray[ObjId];
  *pfVar1 = Rise;
  pfVar1[1] = Fall;
  return;
}

Assistant:

void Abc_NtkTimeSetRequired( Abc_Ntk_t * pNtk, int ObjId, float Rise, float Fall )
{
    Vec_Ptr_t * vTimes;
    Abc_Time_t * pTime;
    if ( pNtk->pManTime == NULL )
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
    Abc_ManTimeExpand( pNtk->pManTime, ObjId + 1, 1 );
    // set the required time
    vTimes = pNtk->pManTime->vReqs;
    pTime = (Abc_Time_t *)vTimes->pArray[ObjId];
    pTime->Rise  = Rise;
    pTime->Fall  = Fall;
}